

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,Material *material,uint32_t indent,
          bool closing_brace)

{
  ulong uVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  const_reference pvVar5;
  AttrMeta *pAVar6;
  uint32_t indent_00;
  string *psVar7;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  uint32_t n_04;
  uint32_t n_05;
  uint32_t n_06;
  uint32_t n_07;
  uint32_t n_08;
  uint32_t n_09;
  Path *p;
  Path *p_00;
  Path *p_01;
  Path *p_02;
  Path *p_03;
  Path *p_04;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  ulong local_418;
  size_t i_2;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_3f0;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *conns_2;
  string local_3c8;
  string local_3a8;
  string local_388;
  ulong local_368;
  size_t i_1;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_340;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *conns_1;
  string local_318;
  string local_2f8;
  string local_2d8;
  ulong local_2b8;
  size_t i;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_290;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *conns;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [379];
  byte local_1d;
  uint local_1c;
  bool closing_brace_local;
  tinyusdz *ptStack_18;
  uint32_t indent_local;
  Material *material_local;
  
  local_1c = (uint)material;
  local_1d = (byte)indent & 1;
  psVar7 = __return_storage_ptr__;
  ptStack_18 = this;
  material_local = (Material *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  indent_00 = (uint32_t)psVar7;
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar3 = std::operator<<(aoStack_198,(string *)&local_1c8);
  to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)*(uint *)(ptStack_18 + 0x20),s);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e8);
  poVar3 = std::operator<<(poVar3," Material \"");
  poVar3 = std::operator<<(poVar3,(string *)ptStack_18);
  std::operator<<(poVar3,"\"\n");
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  bVar2 = PrimMetas::authored((PrimMetas *)((string *)ptStack_18 + 0x30));
  n_02 = n_00;
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)local_1c,n_00);
    poVar3 = std::operator<<(aoStack_198,(string *)&local_208);
    std::operator<<(poVar3,"(\n");
    std::__cxx11::string::~string((string *)&local_208);
    print_prim_metas_abi_cxx11_
              (&local_228,(tinyusdz *)((string *)ptStack_18 + 0x30),
               (PrimMeta *)(ulong)(local_1c + 1),indent_00);
    std::operator<<(aoStack_198,(string *)&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)local_1c,n_01);
    poVar3 = std::operator<<(aoStack_198,(string *)&local_248);
    std::operator<<(poVar3,")\n");
    std::__cxx11::string::~string((string *)&local_248);
    n_02 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_(&local_268,(pprint *)(ulong)local_1c,n_02);
  poVar3 = std::operator<<(aoStack_198,(string *)&local_268);
  std::operator<<(poVar3,"{\n");
  std::__cxx11::string::~string((string *)&local_268);
  bVar2 = TypedConnection<tinyusdz::Token>::authored
                    ((TypedConnection<tinyusdz::Token> *)((string *)ptStack_18 + 0x730));
  if (bVar2) {
    pprint::Indent_abi_cxx11_((string *)&conns,(pprint *)(ulong)(local_1c + 1),n_03);
    poVar3 = std::operator<<(aoStack_198,(string *)&conns);
    std::operator<<(poVar3,"token outputs:surface.connect ");
    std::__cxx11::string::~string((string *)&conns);
    local_290 = TypedConnection<tinyusdz::Token>::get_connections
                          ((TypedConnection<tinyusdz::Token> *)((string *)ptStack_18 + 0x730));
    sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(local_290);
    if (sVar4 == 1) {
      poVar3 = std::operator<<(aoStack_198,"= ");
      pvVar5 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[](local_290,0)
      ;
      (anonymous_namespace)::pquote_abi_cxx11_((string *)&i,(_anonymous_namespace_ *)pvVar5,p);
      std::operator<<(poVar3,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
    }
    else {
      sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(local_290);
      if (1 < sVar4) {
        std::operator<<(aoStack_198,"= [");
        for (local_2b8 = 0; uVar1 = local_2b8,
            sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(local_290),
            uVar1 < sVar4; local_2b8 = local_2b8 + 1) {
          pvVar5 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                             (local_290,local_2b8);
          (anonymous_namespace)::pquote_abi_cxx11_(&local_2d8,(_anonymous_namespace_ *)pvVar5,p_00);
          std::operator<<(aoStack_198,(string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2d8);
          uVar1 = local_2b8;
          sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(local_290);
          if (uVar1 != sVar4 - 1) {
            std::operator<<(aoStack_198,", ");
          }
        }
        std::operator<<(aoStack_198,"]");
        indent_00 = (uint32_t)sVar4;
      }
    }
    pAVar6 = TypedConnection<tinyusdz::Token>::metas
                       ((TypedConnection<tinyusdz::Token> *)((string *)ptStack_18 + 0x730));
    bVar2 = AttrMetas::authored(pAVar6);
    if (bVar2) {
      poVar3 = std::operator<<(aoStack_198,"(\n");
      pAVar6 = TypedConnection<tinyusdz::Token>::metas
                         ((TypedConnection<tinyusdz::Token> *)((string *)ptStack_18 + 0x730));
      print_attr_metas_abi_cxx11_
                (&local_2f8,(tinyusdz *)pAVar6,(AttrMeta *)(ulong)(local_1c + 2),indent_00);
      poVar3 = std::operator<<(poVar3,(string *)&local_2f8);
      pprint::Indent_abi_cxx11_(&local_318,(pprint *)(ulong)(local_1c + 1),n_04);
      poVar3 = std::operator<<(poVar3,(string *)&local_318);
      std::operator<<(poVar3,")");
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_2f8);
    }
    std::operator<<(aoStack_198,"\n");
  }
  bVar2 = TypedConnection<tinyusdz::Token>::authored
                    ((TypedConnection<tinyusdz::Token> *)((string *)ptStack_18 + 0x960));
  if (bVar2) {
    pprint::Indent_abi_cxx11_((string *)&conns_1,(pprint *)(ulong)(local_1c + 1),n_05);
    poVar3 = std::operator<<(aoStack_198,(string *)&conns_1);
    std::operator<<(poVar3,"token outputs:displacement.connect ");
    std::__cxx11::string::~string((string *)&conns_1);
    local_340 = TypedConnection<tinyusdz::Token>::get_connections
                          ((TypedConnection<tinyusdz::Token> *)((string *)ptStack_18 + 0x960));
    sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(local_340);
    if (sVar4 == 1) {
      poVar3 = std::operator<<(aoStack_198,"= ");
      pvVar5 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[](local_340,0)
      ;
      (anonymous_namespace)::pquote_abi_cxx11_((string *)&i_1,(_anonymous_namespace_ *)pvVar5,p_01);
      std::operator<<(poVar3,(string *)&i_1);
      std::__cxx11::string::~string((string *)&i_1);
    }
    else {
      sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(local_340);
      if (1 < sVar4) {
        std::operator<<(aoStack_198,"= [");
        for (local_368 = 0; uVar1 = local_368,
            sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(local_340),
            uVar1 < sVar4; local_368 = local_368 + 1) {
          pvVar5 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                             (local_340,local_368);
          (anonymous_namespace)::pquote_abi_cxx11_(&local_388,(_anonymous_namespace_ *)pvVar5,p_02);
          std::operator<<(aoStack_198,(string *)&local_388);
          std::__cxx11::string::~string((string *)&local_388);
          uVar1 = local_368;
          sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(local_340);
          if (uVar1 != sVar4 - 1) {
            std::operator<<(aoStack_198,", ");
          }
        }
        std::operator<<(aoStack_198,"]");
        indent_00 = (uint32_t)sVar4;
      }
    }
    pAVar6 = TypedConnection<tinyusdz::Token>::metas
                       ((TypedConnection<tinyusdz::Token> *)((string *)ptStack_18 + 0x960));
    bVar2 = AttrMetas::authored(pAVar6);
    if (bVar2) {
      poVar3 = std::operator<<(aoStack_198,"(\n");
      pAVar6 = TypedConnection<tinyusdz::Token>::metas
                         ((TypedConnection<tinyusdz::Token> *)((string *)ptStack_18 + 0x960));
      print_attr_metas_abi_cxx11_
                (&local_3a8,(tinyusdz *)pAVar6,(AttrMeta *)(ulong)(local_1c + 2),indent_00);
      poVar3 = std::operator<<(poVar3,(string *)&local_3a8);
      pprint::Indent_abi_cxx11_(&local_3c8,(pprint *)(ulong)(local_1c + 1),n_06);
      poVar3 = std::operator<<(poVar3,(string *)&local_3c8);
      std::operator<<(poVar3,")");
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3a8);
    }
    std::operator<<(aoStack_198,"\n");
  }
  bVar2 = TypedConnection<tinyusdz::Token>::authored
                    ((TypedConnection<tinyusdz::Token> *)((string *)ptStack_18 + 0xb90));
  if (bVar2) {
    pprint::Indent_abi_cxx11_((string *)&conns_2,(pprint *)(ulong)(local_1c + 1),n_07);
    poVar3 = std::operator<<(aoStack_198,(string *)&conns_2);
    std::operator<<(poVar3,"token outputs:volume.connect ");
    std::__cxx11::string::~string((string *)&conns_2);
    local_3f0 = TypedConnection<tinyusdz::Token>::get_connections
                          ((TypedConnection<tinyusdz::Token> *)((string *)ptStack_18 + 0xb90));
    sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(local_3f0);
    if (sVar4 == 1) {
      poVar3 = std::operator<<(aoStack_198,"= ");
      pvVar5 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[](local_3f0,0)
      ;
      (anonymous_namespace)::pquote_abi_cxx11_((string *)&i_2,(_anonymous_namespace_ *)pvVar5,p_03);
      std::operator<<(poVar3,(string *)&i_2);
      std::__cxx11::string::~string((string *)&i_2);
    }
    else {
      sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(local_3f0);
      if (1 < sVar4) {
        std::operator<<(aoStack_198,"= [");
        for (local_418 = 0; uVar1 = local_418,
            sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(local_3f0),
            uVar1 < sVar4; local_418 = local_418 + 1) {
          pvVar5 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                             (local_3f0,local_418);
          (anonymous_namespace)::pquote_abi_cxx11_(&local_438,(_anonymous_namespace_ *)pvVar5,p_04);
          std::operator<<(aoStack_198,(string *)&local_438);
          std::__cxx11::string::~string((string *)&local_438);
          uVar1 = local_418;
          sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(local_3f0);
          if (uVar1 != sVar4 - 1) {
            std::operator<<(aoStack_198,", ");
          }
        }
        std::operator<<(aoStack_198,"]");
        indent_00 = (uint32_t)sVar4;
      }
    }
    pAVar6 = TypedConnection<tinyusdz::Token>::metas
                       ((TypedConnection<tinyusdz::Token> *)((string *)ptStack_18 + 0xb90));
    bVar2 = AttrMetas::authored(pAVar6);
    if (bVar2) {
      poVar3 = std::operator<<(aoStack_198,"(\n");
      pAVar6 = TypedConnection<tinyusdz::Token>::metas
                         ((TypedConnection<tinyusdz::Token> *)((string *)ptStack_18 + 0xb90));
      print_attr_metas_abi_cxx11_
                (&local_458,(tinyusdz *)pAVar6,(AttrMeta *)(ulong)(local_1c + 2),indent_00);
      poVar3 = std::operator<<(poVar3,(string *)&local_458);
      pprint::Indent_abi_cxx11_(&local_478,(pprint *)(ulong)(local_1c + 1),n_08);
      poVar3 = std::operator<<(poVar3,(string *)&local_478);
      std::operator<<(poVar3,")");
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::~string((string *)&local_458);
    }
    std::operator<<(aoStack_198,"\n");
  }
  print_props(&local_498,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)((string *)ptStack_18 + 0x6d0),local_1c + 1);
  std::operator<<(aoStack_198,(string *)&local_498);
  std::__cxx11::string::~string((string *)&local_498);
  if ((local_1d & 1) != 0) {
    pprint::Indent_abi_cxx11_(&local_4b8,(pprint *)(ulong)local_1c,n_09);
    poVar3 = std::operator<<(aoStack_198,(string *)&local_4b8);
    std::operator<<(poVar3,"}\n");
    std::__cxx11::string::~string((string *)&local_4b8);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Material &material, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(material.spec) << " Material \""
     << material.name << "\"\n";
  if (material.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(material.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  if (material.surface.authored()) {
    // assume connection when authored.
    // TODO: list edit?.
    ss << pprint::Indent(indent + 1) << "token outputs:surface.connect ";

    const auto &conns = material.surface.get_connections();
    if (conns.size() == 1) {
      ss << "= " << pquote(conns[0]);
    } else if (conns.size() > 1) {
      ss << "= [";
      for (size_t i = 0; i < conns.size(); i++) {
        ss << pquote(conns[i]);
        if (i != (conns.size() - 1)) {
          ss << ", ";
        }
      }
      ss << "]";
    }

    if (material.surface.metas().authored()) {
      ss << "(\n"
         << print_attr_metas(material.surface.metas(), indent + 2)
         << pprint::Indent(indent + 1) << ")";
    }
    ss << "\n";
  }

  if (material.displacement.authored()) {
    // assume connection when authored.
    // TODO: list edit?.
    ss << pprint::Indent(indent + 1) << "token outputs:displacement.connect ";

    const auto &conns = material.displacement.get_connections();
    if (conns.size() == 1) {
      ss << "= " << pquote(conns[0]);
    } else if (conns.size() > 1) {
      ss << "= [";
      for (size_t i = 0; i < conns.size(); i++) {
        ss << pquote(conns[i]);
        if (i != (conns.size() - 1)) {
          ss << ", ";
        }
      }
      ss << "]";
    }

    if (material.displacement.metas().authored()) {
      ss << "(\n"
         << print_attr_metas(material.displacement.metas(), indent + 2)
         << pprint::Indent(indent + 1) << ")";
    }
    ss << "\n";
  }

  if (material.volume.authored()) {
    // assume connection when authored.
    // TODO: list edit?.
    ss << pprint::Indent(indent + 1) << "token outputs:volume.connect ";

    const auto &conns = material.volume.get_connections();
    if (conns.size() == 1) {
      ss << "= " << pquote(conns[0]);
    } else if (conns.size() > 1) {
      ss << "= [";
      for (size_t i = 0; i < conns.size(); i++) {
        ss << pquote(conns[i]);
        if (i != (conns.size() - 1)) {
          ss << ", ";
        }
      }
      ss << "]";
    }

    if (material.volume.metas().authored()) {
      ss << "(\n"
         << print_attr_metas(material.volume.metas(), indent + 2)
         << pprint::Indent(indent + 1) << ")";
    }
    ss << "\n";
  }

  ss << print_props(material.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}